

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O2

cs_err cs_open(cs_arch arch,cs_mode mode,csh *handle)

{
  int iVar1;
  cs_err cVar2;
  cs_struct *pcVar3;
  undefined1 auVar4 [16];
  
  auVar4._0_4_ = -(uint)(cs_mem_malloc == (cs_malloc_t)0x0);
  auVar4._4_4_ = -(uint)(cs_mem_calloc == (cs_calloc_t)0x0);
  auVar4._8_4_ = -(uint)(cs_mem_realloc == (cs_realloc_t)0x0);
  auVar4._12_4_ = -(uint)(cs_mem_free == (cs_free_t)0x0);
  iVar1 = movmskps(0x29f418,auVar4);
  if (iVar1 != 0) {
    return CS_ERR_MEMSETUP;
  }
  if (cs_vsnprintf == (cs_vsnprintf_t)0x0) {
    return CS_ERR_MEMSETUP;
  }
  archs_enable();
  cVar2 = CS_ERR_ARCH;
  if ((arch < CS_ARCH_MAX) && (arch_init[arch] != (_func_cs_err_cs_struct_ptr *)0x0)) {
    pcVar3 = (cs_struct *)(*cs_mem_calloc)(1,0xb0);
    if (pcVar3 == (cs_struct *)0x0) {
      return CS_ERR_MEM;
    }
    pcVar3->errnum = CS_ERR_OK;
    pcVar3->arch = arch;
    pcVar3->mode = mode;
    pcVar3->big_endian = SUB41((uint)mode >> 0x1f,0);
    pcVar3->detail = CS_OPT_OFF;
    (pcVar3->skipdata_setup).mnemonic = ".byte";
    cVar2 = (*arch_init[arch])(pcVar3);
    if (cVar2 == CS_ERR_OK) {
      cVar2 = CS_ERR_OK;
      goto LAB_00143ac3;
    }
    (*cs_mem_free)(pcVar3);
  }
  pcVar3 = (cs_struct *)0x0;
LAB_00143ac3:
  *handle = (csh)pcVar3;
  return cVar2;
}

Assistant:

CAPSTONE_EXPORT
cs_err cs_open(cs_arch arch, cs_mode mode, csh *handle)
{
	cs_err err;
	struct cs_struct *ud;
	if (!cs_mem_malloc || !cs_mem_calloc || !cs_mem_realloc || !cs_mem_free || !cs_vsnprintf)
		// Error: before cs_open(), dynamic memory management must be initialized
		// with cs_option(CS_OPT_MEM)
		return CS_ERR_MEMSETUP;

	archs_enable();

	if (arch < CS_ARCH_MAX && arch_init[arch]) {
		ud = cs_mem_calloc(1, sizeof(*ud));
		if (!ud) {
			// memory insufficient
			return CS_ERR_MEM;
		}

		ud->errnum = CS_ERR_OK;
		ud->arch = arch;
		ud->mode = mode;
		ud->big_endian = mode & CS_MODE_BIG_ENDIAN;
		// by default, do not break instruction into details
		ud->detail = CS_OPT_OFF;

		// default skipdata setup
		ud->skipdata_setup.mnemonic = SKIPDATA_MNEM;

		err = arch_init[ud->arch](ud);
		if (err) {
			cs_mem_free(ud);
			*handle = 0;
			return err;
		}

		*handle = (uintptr_t)ud;

		return CS_ERR_OK;
	} else {
		*handle = 0;
		return CS_ERR_ARCH;
	}
}